

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Session session;
  environment env;
  Session *in_stack_fffffffffffffe50;
  char **in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  Session *in_stack_fffffffffffffe68;
  
  diy::mpi::environment::environment((environment *)in_stack_fffffffffffffe50);
  Catch::Session::Session
            ((Session *)
             session.m_cli.m_options.
             super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = Catch::Session::run<char>
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe58);
  Catch::Session::~Session(in_stack_fffffffffffffe50);
  diy::mpi::environment::~environment((environment *)0x1494f9);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  diy::mpi::environment env;

  Catch::Session session;
  return session.run(argc, argv);
}